

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,State *state)

{
  undefined1 auVar1 [16];
  Vector *this_00;
  long lVar2;
  int *piVar3;
  undefined1 in_ZMM0 [64];
  
  this_00 = &state->hidden;
  Vector::zero(this_00);
  piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = -(long)piVar3;
  for (; piVar3 != (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    Vector::addRow(this_00,(this->wi_).
                           super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)*piVar3);
    lVar2 = lVar2 + -4;
  }
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                              -(lVar2 + (long)(input->super__Vector_base<int,_std::allocator<int>_>)
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
  Vector::mul(this_00,(float)(1.0 / auVar1._0_8_));
  return;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, State& state)
    const {
  Vector& hidden = state.hidden;
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}